

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,IStreamingReporter *p)

{
  IStreamingReporter *pIVar1;
  
  if (p != (IStreamingReporter *)0x0) {
    (*(p->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(p);
  }
  pIVar1 = this->m_p;
  this->m_p = p;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }